

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

ps_lattice_t * ngram_search_lattice(ps_search_t *search)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  dictword_t *pdVar4;
  ps_latnode_t *ppVar5;
  int iVar6;
  int32 iVar7;
  long lVar8;
  ps_lattice_t *ppVar9;
  ps_latnode_t *ppVar10;
  long lVar11;
  ps_latnode_s *ppVar12;
  int32 *piVar13;
  int iVar14;
  ulong uVar15;
  bptbl_t *be;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  float32 lwf;
  int32 lscr;
  int32 ascr;
  ulong local_40;
  int32 local_34;
  
  lVar8 = ps_config_int(search->config,"min_endfr");
  if (*(int *)&search[3].last_link < -0x1fffffff) {
    return (ps_lattice_t *)0x0;
  }
  ppVar9 = search->dag;
  if ((ppVar9 != (ps_lattice_t *)0x0) && (ppVar9->n_frames == *(int *)((long)&search[3].type + 4)))
  {
    return ppVar9;
  }
  ps_lattice_free(ppVar9);
  search->dag = (ps_lattice_t *)0x0;
  ppVar9 = ps_lattice_init_search(search,*(int *)((long)&search[3].type + 4));
  if (*(char *)((long)&search[1].name + 1) == '\0') {
    lwf = 1.0;
  }
  else {
    lwf = *(float32 *)((long)&search[3].dag + 4);
  }
  iVar22 = search[2].start_wid;
  if (0 < iVar22) {
    piVar20 = *(int **)&search[2].post;
    iVar18 = 0;
    do {
      if ((char)piVar20[1] != '\0') {
        if ((long)piVar20[3] < 0) {
          iVar22 = 0;
        }
        else {
          iVar22 = *(int *)(*(long *)&search[2].post + (long)piVar20[3] * 0x24) + 1;
        }
        if (ppVar9->n_frames <= *piVar20) {
          __assert_fail("ef < dag->n_frames",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                        ,0x43c,"void create_dag_nodes(ngram_search_t *, ps_lattice_t *)");
        }
        iVar14 = piVar20[2];
        if (((iVar14 != search->finish_wid) || (ppVar9->n_frames + -1 <= *piVar20)) &&
           ((iVar6 = dict_filler_word(search->dict,iVar14), iVar6 != 0 ||
            (iVar7 = ngram_model_set_known_wid
                               ((ngram_model_t *)search[1].vt,search->dict->word[iVar14].basewid),
            iVar7 != 0)))) {
          for (ppVar10 = ppVar9->nodes; ppVar10 != (ps_latnode_t *)0x0; ppVar10 = ppVar10->next) {
            if ((ppVar10->wid == iVar14) && (ppVar10->sf == iVar22)) {
              ppVar10->lef = iVar18;
              goto LAB_00137920;
            }
          }
          ppVar10 = (ps_latnode_t *)
                    __listelem_malloc__(ppVar9->latnode_alloc,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                        ,0x452);
          ppVar10->wid = iVar14;
          ppVar10->sf = iVar22;
          ppVar10->lef = iVar18;
          ppVar10->fef = iVar18;
          ppVar10->reachable = 0;
          ppVar10->exits = (latlink_list_t *)0x0;
          ppVar10->entries = (latlink_list_t *)0x0;
          ppVar10->next = ppVar9->nodes;
          ppVar9->nodes = ppVar10;
          ppVar9->n_nodes = ppVar9->n_nodes + 1;
        }
      }
LAB_00137920:
      iVar18 = iVar18 + 1;
      piVar20 = piVar20 + 9;
      iVar22 = search[2].start_wid;
    } while (iVar18 < iVar22);
  }
  ppVar12 = ppVar9->nodes;
  if (ppVar12 != (ps_latnode_t *)0x0) {
    uVar19 = search->start_wid;
    ppVar10 = ppVar12;
    do {
      if ((ppVar10->wid == uVar19) && (ppVar10->sf == 0)) {
        ppVar9->start = ppVar10;
        fVar2 = (float)search[3].n_words;
        goto LAB_001379b5;
      }
      ppVar10 = ppVar10->next;
    } while (ppVar10 != (ps_latnode_s *)0x0);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
          ,0x470,"Couldn\'t find <s> in first frame\n");
  ppVar9->start = (ps_latnode_t *)0x0;
  goto LAB_00137982;
  while (ppVar12 = ppVar12->next, ppVar12 != (ps_latnode_s *)0x0) {
LAB_001379b5:
    if ((ppVar12->wid == search->finish_wid) &&
       (*(int *)(*(long *)&search[2].post + (long)ppVar12->lef * 0x24) == ppVar9->n_frames + -1))
    goto LAB_00137bc1;
  }
  uVar15 = (ulong)(uint)ppVar9->n_frames;
  do {
    if ((int)uVar15 < 1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x48d,"Empty backpointer table: can not build DAG.\n");
      goto LAB_00137bad;
    }
    uVar1 = uVar15 - 1;
    pcVar16 = search[3].name;
    lVar24 = uVar15 * 4;
    uVar15 = uVar1;
  } while (*(int *)(pcVar16 + lVar24 + -4) == iVar22);
  lVar24 = (long)*(int *)(pcVar16 + (uVar1 & 0xffffffff) * 4);
  local_40 = (ulong)((int)uVar1 + 1U & 0x7fffffff);
  if (*(int *)(pcVar16 + (uVar1 & 0xffffffff) * 4) < *(int *)(pcVar16 + local_40 * 4)) {
    lVar11._0_4_ = search[2].post;
    lVar11._4_4_ = search[2].n_words;
    lVar21 = lVar24 * 0x24;
    iVar22 = -1;
    iVar18 = -0x20000000;
    do {
      iVar14 = *(int *)(lVar11 + 0x18 + lVar21);
      iVar6 = (int)lVar24;
      if (iVar14 == search->finish_wid) break;
      iVar7 = ngram_tg_score((ngram_model_t *)search[1].vt,search->finish_wid,iVar14,
                             *(int32 *)(lVar11 + 0x1c + lVar21),&local_34);
      lVar11 = *(long *)&search[2].post;
      iVar14 = (int)((float)(iVar7 >> 10) * fVar2) + *(int *)(lVar11 + 0x10 + lVar21);
      if (iVar18 < iVar14) {
        iVar18 = iVar14;
        iVar22 = (int)lVar24;
      }
      lVar24 = lVar24 + 1;
      lVar21 = lVar21 + 0x24;
      iVar6 = iVar22;
    } while (lVar24 < *(int *)(search[3].name + local_40 * 4));
    if (iVar6 == -1) goto LAB_00137b8b;
    pdVar4 = search->dict->word;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4aa,"</s> not found in last frame, using %s.%d instead\n",
            pdVar4[pdVar4[*(int *)(lVar11 + 8 + (long)iVar6 * 0x24)].basewid].word,
            uVar1 & 0xffffffff);
    ppVar12 = ppVar9->nodes;
    if (ppVar12 != (ps_latnode_t *)0x0) {
      while (ppVar12->lef != iVar6) {
        ppVar12 = ppVar12->next;
        if (ppVar12 == (ps_latnode_s *)0x0) goto LAB_00137b45;
      }
      ppVar10 = ppVar9->start;
      uVar19 = ppVar10->wid;
LAB_00137bc1:
      ppVar9->end = ppVar12;
      if ((int)uVar19 < 0) {
        pcVar16 = (char *)0x0;
      }
      else {
        pcVar16 = search->dict->word[uVar19].word;
      }
      uVar19 = 0;
      if ((long)ppVar12->wid < 0) {
        pcVar17 = (char *)0x0;
      }
      else {
        pcVar17 = search->dict->word[ppVar12->wid].word;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x4df,"lattice start node %s.%d end node %s.%d\n",pcVar16,(ulong)(uint)ppVar10->sf,
              pcVar17,(ulong)(uint)ppVar12->sf);
      ngram_compute_seg_score
                ((ngram_search_t *)search,
                 (bptbl_t *)((long)ppVar9->end->lef * 0x24 + *(long *)&search[2].post),lwf,
                 &ppVar9->final_node_ascr,&lscr);
      if (ppVar9->nodes != (ps_latnode_t *)0x0) {
        uVar19 = 0;
        ppVar10 = ppVar9->nodes;
        do {
          if (ppVar10 == ppVar9->end) break;
          ppVar12 = ppVar10->next;
          __listelem_free__(ppVar9->latnode_alloc,ppVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0x4f5);
          ppVar9->nodes = ppVar12;
          uVar19 = uVar19 + 1;
          ppVar10 = ppVar12;
        } while (ppVar12 != (ps_latnode_s *)0x0);
      }
      uVar23 = 0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x4f9,"Eliminated %d nodes before end node\n",(ulong)uVar19);
      ppVar10 = ppVar9->end;
      ppVar10->reachable = 1;
      do {
        if (ppVar10->reachable != 0) {
          if ((ppVar10 == ppVar9->end) ||
             ((int)lVar8 <=
              *(int *)(*(long *)&search[2].post + (long)ppVar10->lef * 0x24) -
              *(int *)(*(long *)&search[2].post + (long)ppVar10->fef * 0x24))) {
            for (ppVar12 = ppVar10->next; ppVar12 != (ps_latnode_t *)0x0; ppVar12 = ppVar12->next) {
              lVar24 = *(long *)&search[2].post;
              iVar22 = ppVar12->fef;
              iVar18 = *(int *)(lVar24 + (long)iVar22 * 0x24);
              iVar14 = ppVar10->sf;
              if (iVar18 < iVar14) {
                iVar6 = ppVar12->lef;
                iVar3 = *(int *)(lVar24 + (long)iVar6 * 0x24);
                if (iVar14 <= iVar3 + 1) {
                  if (iVar3 - iVar18 < (int)lVar8) {
                    if (ppVar12->reachable != 0) {
                      __assert_fail("!from->reachable",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                    ,0x516,"ps_lattice_t *ngram_search_lattice(ps_search_t *)");
                    }
                  }
                  else if (iVar22 <= iVar6) {
                    be = (bptbl_t *)(lVar24 + (long)iVar22 * 0x24);
                    iVar22 = (iVar6 - iVar22) + 1;
                    do {
                      if ((be->wid == ppVar12->wid) && (iVar14 + -1 <= be->frame)) {
                        if (be->frame == iVar14 + -1) {
                          ngram_compute_seg_score((ngram_search_t *)search,be,lwf,&ascr,&lscr);
                          if ((long)be->last2_phone == -1) {
                            piVar13 = &be->score;
                          }
                          else {
                            piVar13 = (int32 *)(((long)search->d2p->rssid[be->last_phone]
                                                       [be->last2_phone].cimap
                                                       [*search->dict->word[ppVar10->wid].ciphone] +
                                                (long)be->s_idx) * 4 +
                                               *(long *)&search[2].finish_wid);
                          }
                          if (*piVar13 != -0x20000000) {
                            iVar22 = *piVar13 - be->score;
                            iVar18 = iVar22 + ascr;
                            iVar7 = -0x67932;
                            if ((iVar18 != 0 && SCARRY4(iVar22,ascr) == iVar18 < 0) ||
                               (iVar7 = iVar18, -0x20000000 < iVar18)) {
                              ps_lattice_link(ppVar9,ppVar12,ppVar10,iVar7,be->frame);
                              uVar23 = uVar23 + 1;
                              ppVar12->reachable = 1;
                            }
                          }
                        }
                        break;
                      }
                      be = be + 1;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                }
              }
            }
          }
          else {
            ppVar10->reachable = 0;
          }
        }
        ppVar10 = ppVar10->next;
      } while (ppVar10 != (ps_latnode_s *)0x0);
      if (ppVar9->start->reachable == 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x54a,"End node of lattice isolated; unreachable\n");
        goto LAB_00137982;
      }
      ppVar10 = ppVar9->nodes;
      if (ppVar10 == (ps_latnode_t *)0x0) {
LAB_00137f1a:
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x562,"Lattice has %d nodes, %d links\n",(ulong)(uint)ppVar9->n_nodes,(ulong)uVar23
               );
        iVar22 = dict_filler_word(search->dict,ppVar9->end->wid);
        if (iVar22 != 0) {
          ppVar9->end->basewid = search->finish_wid;
        }
        ps_lattice_delete_unreachable(ppVar9);
        ps_lattice_penalize_fillers
                  (ppVar9,*(int32 *)&search[6].name,*(int32 *)((long)&search[6].type + 4));
        search->dag = ppVar9;
        return ppVar9;
      }
      lVar8 = *(long *)&search[2].post;
      pdVar4 = search->dict->word;
      ppVar12 = ppVar10;
      do {
        ppVar12->fef = *(int32 *)(lVar8 + (long)ppVar12->fef * 0x24);
        ppVar12->lef = *(int32 *)(lVar8 + (long)ppVar12->lef * 0x24);
        ppVar12->basewid = pdVar4[ppVar12->wid].basewid;
        ppVar12 = ppVar12->next;
      } while (ppVar12 != (ps_latnode_s *)0x0);
      do {
        ppVar5 = ppVar10;
        if ((ppVar5 == (ps_latnode_t *)0x0) ||
           (ppVar10 = ppVar5->next, ppVar10 == (ps_latnode_s *)0x0)) goto LAB_00137f1a;
        ppVar12 = ppVar10;
        do {
          if (ppVar12->sf != ppVar5->sf) break;
          if (ppVar12->basewid == ppVar5->basewid) {
            ppVar12->alt = ppVar5->alt;
            ppVar5->alt = ppVar12;
            ppVar10 = ppVar5->next;
            break;
          }
          ppVar12 = ppVar12->next;
        } while (ppVar12 != (ps_latnode_s *)0x0);
      } while( true );
    }
LAB_00137b45:
    pdVar4 = search->dict->word;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4b4,"Failed to find DAG node corresponding to %s\n",
            pdVar4[pdVar4[*(int *)(*(long *)&search[2].post + 8 + (long)iVar6 * 0x24)].basewid].word
           );
  }
  else {
LAB_00137b8b:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
            ,0x4a6,"No word exits found in last frame (%d), assuming no recognition\n",
            uVar1 & 0xffffffff);
  }
LAB_00137bad:
  ppVar9->end = (ps_latnode_t *)0x0;
LAB_00137982:
  ps_lattice_free(ppVar9);
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ngram_search_lattice(ps_search_t *search)
{
    int32 i, score, ascr, lscr;
    ps_latnode_t *node, *from, *to;
    ngram_search_t *ngs;
    ps_lattice_t *dag;
    int min_endfr, nlink;
    float lwf;

    ngs = (ngram_search_t *)search;
    min_endfr = ps_config_int(ps_search_config(search), "min_endfr");

    /* If the best score is WORST_SCORE or worse, there is no way to
     * make a lattice. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return NULL;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == ngs->n_frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, ngs->n_frame);
    /* Compute these such that they agree with the fwdtree language weight. */
    lwf = ngs->fwdflat ? ngs->fwdflat_fwdtree_lw_ratio : 1.0;
    create_dag_nodes(ngs, dag);
    if ((dag->start = find_start_node(ngs, dag)) == NULL)
        goto error_out;
    if ((dag->end = find_end_node(ngs, dag, ngs->bestpath_fwdtree_lw_ratio)) == NULL)
        goto error_out;
    E_INFO("lattice start node %s.%d end node %s.%d\n",
           dict_wordstr(search->dict, dag->start->wid), dag->start->sf,
           dict_wordstr(search->dict, dag->end->wid), dag->end->sf);

    ngram_compute_seg_score(ngs, ngs->bp_table + dag->end->lef, lwf,
                            &dag->final_node_ascr, &lscr);

    /*
     * At this point, dag->nodes is ordered such that nodes earlier in
     * the list can follow (in time) those later in the list, but not
     * vice versa (see above - also note that adjacency is purely
     * determined by time which is why we can make this claim).  Now
     * create precedence links and simultanesously mark all nodes that
     * can reach dag->end.  (All nodes are reached from dag->start
     * simply by definition - they were created that way).
     *
     * Note that this also means that any nodes before dag->end in the
     * list can be discarded, meaning that dag->end will always be
     * equal to dag->nodes (FIXME: except when loading from a file but
     * we can fix that...)
     */
    i = 0;
    while (dag->nodes && dag->nodes != dag->end) {
        ps_latnode_t *next = dag->nodes->next;
        listelem_free(dag->latnode_alloc, dag->nodes);
        dag->nodes = next;
        ++i;
    }
    E_INFO("Eliminated %d nodes before end node\n", i);
    dag->end->reachable = TRUE;
    nlink = 0;
    for (to = dag->end; to; to = to->next) {
        int fef, lef;

        /* Skip if not reachable; it will never be reachable from dag->end */
        if (!to->reachable)
            continue;

        /* Prune nodes with too few endpoints - heuristic
           borrowed from Sphinx3 */
        fef = ngs->bp_table[to->fef].frame;
        lef = ngs->bp_table[to->lef].frame;
        if (to != dag->end && lef - fef < min_endfr) {
            to->reachable = FALSE;
            continue;
        }

        /* Find predecessors of to : from->fef+1 <= to->sf <= from->lef+1 */
        for (from = to->next; from; from = from->next) {
            bptbl_t *from_bpe;

            fef = ngs->bp_table[from->fef].frame;
            lef = ngs->bp_table[from->lef].frame;

            if ((to->sf <= fef) || (to->sf > lef + 1))
                continue;
            if (lef - fef < min_endfr) {
                assert(!from->reachable);
                continue;
            }

            /* Find bptable entry for "from" that exactly precedes "to" */
            i = from->fef;
            from_bpe = ngs->bp_table + i;
            for (; i <= from->lef; i++, from_bpe++) {
                if (from_bpe->wid != from->wid)
                    continue;
                if (from_bpe->frame >= to->sf - 1)
                    break;
            }

            if ((i > from->lef) || (from_bpe->frame != to->sf - 1))
                continue;

            /* Find acoustic score from.sf->to.sf-1 with right context = to */
            /* This gives us from_bpe's best acoustic score. */
            ngram_compute_seg_score(ngs, from_bpe, lwf,
                                    &ascr, &lscr);
            /* Now find the exact path score for from->to, including
             * the appropriate final triphone.  In fact this might not
             * exist. */
            score = ngram_search_exit_score(ngs, from_bpe,
                                            dict_first_phone(ps_search_dict(ngs), to->wid));
            /* Does not exist.  Can't create a link here. */
            if (score == WORST_SCORE)
                continue;
            /* Adjust the arc score to match the correct triphone. */
            else
                score = ascr + (score - from_bpe->score);
            if (score BETTER_THAN 0) {
                /* Scores must be negative, or Bad Things will happen.
                   In general, they are, except in corner cases
                   involving filler words.  We don't want to throw any
                   links away so we'll keep these, but with some
                   arbitrarily improbable but recognizable score. */
                ps_lattice_link(dag, from, to, -424242, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
            else if (score BETTER_THAN WORST_SCORE) {
                ps_lattice_link(dag, from, to, score, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
        }
    }

    /* There must be at least one path between dag->start and dag->end */
    if (!dag->start->reachable) {
        E_ERROR("End node of lattice isolated; unreachable\n");
        goto error_out;
    }

    for (node = dag->nodes; node; node = node->next) {
        /* Change node->{fef,lef} from bptbl indices to frames. */
        node->fef = ngs->bp_table[node->fef].frame;
        node->lef = ngs->bp_table[node->lef].frame;
        /* Find base wid for nodes. */
        node->basewid = dict_basewid(search->dict, node->wid);
    }

    /* Link nodes with alternate pronunciations at the same timepoint. */
    for (node = dag->nodes; node; node = node->next) {
        ps_latnode_t *alt;
        /* Scan forward to find the next alternate, then stop. */
        for (alt = node->next; alt && alt->sf == node->sf; alt = alt->next) {
            if (alt->basewid == node->basewid) {
                alt->alt = node->alt;
                node->alt = alt;
                break;
            }
        }
    }
    E_INFO("Lattice has %d nodes, %d links\n", dag->n_nodes, nlink);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(ps_search_dict(ngs), dag->end->wid))
        dag->end->basewid = ps_search_finish_wid(ngs);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    /* Add silprob and fillprob to corresponding links */
    ps_lattice_penalize_fillers(dag, ngs->silpen, ngs->fillpen);

    search->dag = dag;
    return dag;

error_out:
    ps_lattice_free(dag);
    return NULL;
}